

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O2

uint hpte_page_shift(PPCHash64SegmentPageSizes *sps,uint64_t pte0,uint64_t pte1)

{
  uint uVar1;
  long lVar2;
  
  if ((pte0 & 4) == 0) {
    uVar1 = 0;
    if (sps->page_shift == 0xc) {
      uVar1 = 0xc;
    }
  }
  else {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      uVar1 = sps->enc[lVar2].page_shift;
      if (uVar1 != 0xc) {
        if (uVar1 == 0) {
          return 0;
        }
        if ((~(-1L << ((byte)uVar1 & 0x3f)) & pte1 & 0xffffffffffff000) ==
            (ulong)sps->enc[lVar2].pte_enc << 0xc) {
          return uVar1;
        }
      }
    }
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned hpte_page_shift(const PPCHash64SegmentPageSizes *sps,
                                uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        if (sps->page_shift != 12) {
            /* 4kiB page in a non 4kiB segment */
            return 0;
        }
        /* Normal 4kiB page */
        return 12;
    }

    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64PageSize *ps = &sps->enc[i];
        uint64_t mask;

        if (!ps->page_shift) {
            break;
        }

        if (ps->page_shift == 12) {
            /* L bit is set so this can't be a 4kiB page */
            continue;
        }

        mask = ((1ULL << ps->page_shift) - 1) & HPTE64_R_RPN;

        if ((pte1 & mask) == ((uint64_t)ps->pte_enc << HPTE64_R_RPN_SHIFT)) {
            return ps->page_shift;
        }
    }

    return 0; /* Bad page size encoding */
}